

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prediction_scheme_normal_octahedron_canonicalized_decoding_transform.h
# Opt level: O2

void __thiscall
draco::PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<int>::ComputeOriginalValue
          (PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<int> *this,
          DataType *pred_vals,CorrType *corr_vals,DataType *out_orig_vals)

{
  Point2 orig;
  undefined1 local_50 [8];
  Self local_48;
  Self local_40;
  VectorD<int,_2> local_38;
  VectorD<int,_2> local_30;
  
  local_40.v_._M_elems = *(array<int,_2UL> *)pred_vals;
  local_48.v_._M_elems = *(array<int,_2UL> *)corr_vals;
  VectorD<int,_2>::VectorD(&local_30,&local_40);
  VectorD<int,_2>::VectorD(&local_38,&local_48);
  ComputeOriginalValue
            ((PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<int> *)local_50,
             (Point2 *)this,&local_30);
  *(undefined1 (*) [8])out_orig_vals = local_50;
  return;
}

Assistant:

inline void ComputeOriginalValue(const DataType *pred_vals,
                                   const CorrType *corr_vals,
                                   DataType *out_orig_vals) const {
    DRACO_DCHECK_LE(pred_vals[0], 2 * this->center_value());
    DRACO_DCHECK_LE(pred_vals[1], 2 * this->center_value());
    DRACO_DCHECK_LE(corr_vals[0], 2 * this->center_value());
    DRACO_DCHECK_LE(corr_vals[1], 2 * this->center_value());

    DRACO_DCHECK_LE(0, pred_vals[0]);
    DRACO_DCHECK_LE(0, pred_vals[1]);
    DRACO_DCHECK_LE(0, corr_vals[0]);
    DRACO_DCHECK_LE(0, corr_vals[1]);

    const Point2 pred = Point2(pred_vals[0], pred_vals[1]);
    const Point2 corr = Point2(corr_vals[0], corr_vals[1]);
    const Point2 orig = ComputeOriginalValue(pred, corr);

    out_orig_vals[0] = orig[0];
    out_orig_vals[1] = orig[1];
  }